

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholding.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::ClassConfidenceThresholding::_InternalSerialize
          (ClassConfidenceThresholding *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint value;
  void *data;
  Type *this_00;
  ulong uVar1;
  int iVar2;
  uint8_t *puVar3;
  int index;
  size_t __n;
  
  iVar2 = (this->precisionrecallcurves_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                          (&(this->precisionrecallcurves_).super_RepeatedPtrFieldBase,index);
      target[0] = 0xa2;
      target[1] = '\x06';
      value = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[2] = (uint8_t)value;
      if (value < 0x80) {
        puVar3 = target + 3;
      }
      else {
        puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (value,target + 2);
      }
      target = PrecisionRecallCurve::_InternalSerialize(this_00,puVar3,stream);
      index = index + 1;
    } while (iVar2 != index);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = uVar1 & 0xfffffffffffffffc;
    data = *(void **)(uVar1 + 8);
    iVar2 = (int)*(undefined8 *)(uVar1 + 0x10);
    __n = (size_t)iVar2;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,iVar2,target)
      ;
      return puVar3;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* ClassConfidenceThresholding::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ClassConfidenceThresholding)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.PrecisionRecallCurve precisionRecallCurves = 100;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_precisionrecallcurves_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(100, this->_internal_precisionrecallcurves(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ClassConfidenceThresholding)
  return target;
}